

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

MPP_RET try_proc_processing_task(MppEncImpl *enc,EncAsyncWait *wait)

{
  EncAsyncTaskInfo *info_00;
  MPP_RET ret;
  EncAsyncTaskInfo *info;
  HalTaskHnd hnd;
  EncAsyncWait *wait_local;
  MppEncImpl *enc_local;
  
  info = (EncAsyncTaskInfo *)0x0;
  hnd = wait;
  wait_local = (EncAsyncWait *)enc;
  enc_local._4_4_ = hal_task_get_hnd(enc->tasks,1,&info);
  if (enc_local._4_4_ == MPP_OK) {
    info_00 = (EncAsyncTaskInfo *)hal_task_hnd_get_data(info);
    if ((((info_00->status).val >> 0x1b & 1) != 0) &&
       (_mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"!info->status.enc_done"
                   ,"try_proc_processing_task",0xc3d), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    enc_async_wait_task((MppEncImpl *)&wait_local->field_1,info_00);
    hal_task_hnd_set_status(info,0);
    *(ushort *)hnd = *hnd & 0xffef;
    enc_local._4_4_ = MPP_OK;
  }
  return enc_local._4_4_;
}

Assistant:

static MPP_RET try_proc_processing_task(MppEncImpl *enc, EncAsyncWait *wait)
{
    HalTaskHnd hnd = NULL;
    EncAsyncTaskInfo *info = NULL;
    MPP_RET ret = MPP_NOK;

    ret = hal_task_get_hnd(enc->tasks, TASK_PROCESSING, &hnd);
    if (ret)
        return ret;

    info = (EncAsyncTaskInfo *)hal_task_hnd_get_data(hnd);

    mpp_assert(!info->status.enc_done);

    enc_async_wait_task(enc, info);
    hal_task_hnd_set_status(hnd, TASK_IDLE);
    wait->task_hnd = 0;

    return MPP_OK;
}